

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void mspace_free(mspace msp,void *mem)

{
  long *plVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong *puVar11;
  long lVar12;
  ulong *puVar13;
  ulong *puVar14;
  long lVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong uVar19;
  size_t __len;
  
  if (mem == (void *)0x0) {
    return;
  }
  puVar14 = (ulong *)((long)mem + -0x10);
  puVar11 = *(ulong **)((long)msp + 0x18);
  if ((puVar14 < puVar11) || (uVar10 = *(ulong *)((long)mem + -8), ((uint)uVar10 & 3) == 1))
  goto LAB_001047f4;
  uVar4 = uVar10 & 0xfffffffffffffff8;
  puVar13 = (ulong *)((long)puVar14 + uVar4);
  if ((uVar10 & 1) == 0) {
    uVar5 = *puVar14;
    if ((uVar10 & 2) == 0) {
      __len = uVar4 + uVar5 + 0x20;
      iVar3 = munmap((void *)((long)puVar14 - uVar5),__len);
      if (iVar3 != 0) {
        return;
      }
      *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
      return;
    }
    puVar14 = (ulong *)((long)puVar14 - uVar5);
    if (puVar14 < puVar11) goto LAB_001047f4;
    uVar4 = uVar4 + uVar5;
    if (puVar14 == *(ulong **)((long)msp + 0x20)) {
      uVar10 = puVar13[1];
      if ((~(uint)uVar10 & 3) == 0) {
        *(ulong *)((long)msp + 8) = uVar4;
        puVar13[1] = uVar10 & 0xfffffffffffffffe;
        puVar14[1] = uVar4 | 1;
        *puVar13 = uVar4;
        return;
      }
    }
    else if (uVar5 < 0x100) {
      puVar8 = (ulong *)puVar14[2];
      puVar16 = (ulong *)puVar14[3];
      puVar17 = (ulong *)((long)msp + (uVar5 >> 3) * 0x10 + 0x48);
      if ((puVar8 != puVar17) && ((puVar8 < puVar11 || ((ulong *)puVar8[3] != puVar14))))
      goto LAB_001047f4;
      if (puVar16 == puVar8) {
        bVar6 = (byte)(uVar5 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      }
      else {
        if ((puVar16 != puVar17) && ((puVar16 < puVar11 || ((ulong *)puVar16[2] != puVar14))))
        goto LAB_001047f4;
        puVar8[3] = (ulong)puVar16;
        puVar16[2] = (ulong)puVar8;
      }
    }
    else {
      puVar8 = (ulong *)puVar14[3];
      uVar10 = puVar14[6];
      if (puVar8 == puVar14) {
        if ((ulong *)puVar14[5] == (ulong *)0x0) {
          if ((ulong *)puVar14[4] == (ulong *)0x0) {
            puVar8 = (ulong *)0x0;
            goto LAB_00104342;
          }
          puVar16 = (ulong *)puVar14[4];
          puVar17 = puVar14 + 4;
        }
        else {
          puVar16 = (ulong *)puVar14[5];
          puVar17 = puVar14 + 5;
        }
        do {
          do {
            puVar18 = puVar17;
            puVar8 = puVar16;
            puVar16 = (ulong *)puVar8[5];
            puVar17 = puVar8 + 5;
          } while ((ulong *)puVar8[5] != (ulong *)0x0);
          puVar16 = (ulong *)puVar8[4];
          puVar17 = puVar8 + 4;
        } while ((ulong *)puVar8[4] != (ulong *)0x0);
        if (puVar18 < puVar11) goto LAB_001047f4;
        *puVar18 = 0;
      }
      else {
        puVar16 = (ulong *)puVar14[2];
        if (((puVar16 < puVar11) || ((ulong *)puVar16[3] != puVar14)) ||
           ((ulong *)puVar8[2] != puVar14)) goto LAB_001047f4;
        puVar16[3] = (ulong)puVar8;
        puVar8[2] = (ulong)puVar16;
      }
LAB_00104342:
      if (uVar10 != 0) {
        uVar9 = (uint)puVar14[7];
        if (puVar14 == *(ulong **)((long)msp + (ulong)uVar9 * 8 + 600)) {
          *(ulong **)((long)msp + (ulong)uVar9 * 8 + 600) = puVar8;
          if (puVar8 == (ulong *)0x0) {
            bVar6 = (byte)uVar9 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          }
          else {
LAB_00104384:
            puVar11 = *(ulong **)((long)msp + 0x18);
            if (puVar8 < puVar11) goto LAB_001047f4;
            puVar8[6] = uVar10;
            puVar16 = (ulong *)puVar14[4];
            if (puVar16 != (ulong *)0x0) {
              if (puVar16 < puVar11) goto LAB_001047f4;
              puVar8[4] = (ulong)puVar16;
              puVar16[6] = (ulong)puVar8;
            }
            uVar10 = puVar14[5];
            if (uVar10 != 0) {
              if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_001047f4;
              puVar8[5] = uVar10;
              *(ulong **)(uVar10 + 0x30) = puVar8;
            }
          }
        }
        else {
          if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_001047f4;
          *(ulong **)(uVar10 + 0x20 + (ulong)(*(ulong **)(uVar10 + 0x20) != puVar14) * 8) = puVar8;
          if (puVar8 != (ulong *)0x0) goto LAB_00104384;
        }
      }
    }
  }
  if ((puVar13 <= puVar14) || (uVar10 = puVar13[1], (uVar10 & 1) == 0)) goto LAB_001047f4;
  if ((uVar10 & 2) == 0) {
    if (puVar13 == *(ulong **)((long)msp + 0x28)) {
      uVar4 = uVar4 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar4;
      *(ulong **)((long)msp + 0x28) = puVar14;
      puVar14[1] = uVar4 | 1;
      if (puVar14 == *(ulong **)((long)msp + 0x20)) {
        *(undefined8 *)((long)msp + 0x20) = 0;
        *(undefined8 *)((long)msp + 8) = 0;
      }
      if (uVar4 <= *(ulong *)((long)msp + 0x30)) {
        return;
      }
      sys_trim((mstate)msp,0);
      return;
    }
    if (puVar13 == *(ulong **)((long)msp + 0x20)) {
      uVar4 = uVar4 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar4;
      *(ulong **)((long)msp + 0x20) = puVar14;
      puVar14[1] = uVar4 | 1;
      *(ulong *)((long)puVar14 + uVar4) = uVar4;
      return;
    }
    if (uVar10 < 0x100) {
      uVar5 = puVar13[2];
      uVar2 = puVar13[3];
      uVar19 = (long)msp + (uVar10 >> 3) * 0x10 + 0x48;
      if ((uVar5 != uVar19) &&
         ((uVar5 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar5 + 0x18) != puVar13))))
      goto LAB_001047f4;
      if (uVar2 == uVar5) {
        bVar6 = (byte)(uVar10 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      }
      else {
        if ((uVar2 != uVar19) &&
           ((uVar2 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar2 + 0x10) != puVar13))))
        goto LAB_001047f4;
        *(ulong *)(uVar5 + 0x18) = uVar2;
        *(ulong *)(uVar2 + 0x10) = uVar5;
      }
    }
    else {
      puVar11 = (ulong *)puVar13[3];
      uVar5 = puVar13[6];
      if (puVar11 == puVar13) {
        if ((ulong *)puVar13[5] == (ulong *)0x0) {
          if ((ulong *)puVar13[4] == (ulong *)0x0) {
            puVar11 = (ulong *)0x0;
            goto LAB_00104734;
          }
          puVar8 = (ulong *)puVar13[4];
          puVar16 = puVar13 + 4;
        }
        else {
          puVar8 = (ulong *)puVar13[5];
          puVar16 = puVar13 + 5;
        }
        do {
          do {
            puVar17 = puVar16;
            puVar11 = puVar8;
            puVar8 = (ulong *)puVar11[5];
            puVar16 = puVar11 + 5;
          } while ((ulong *)puVar11[5] != (ulong *)0x0);
          puVar8 = (ulong *)puVar11[4];
          puVar16 = puVar11 + 4;
        } while ((ulong *)puVar11[4] != (ulong *)0x0);
        if (puVar17 < *(ulong **)((long)msp + 0x18)) goto LAB_001047f4;
        *puVar17 = 0;
      }
      else {
        uVar2 = puVar13[2];
        if (((uVar2 < *(ulong *)((long)msp + 0x18)) || (*(ulong **)(uVar2 + 0x18) != puVar13)) ||
           ((ulong *)puVar11[2] != puVar13)) goto LAB_001047f4;
        *(ulong **)(uVar2 + 0x18) = puVar11;
        puVar11[2] = uVar2;
      }
LAB_00104734:
      if (uVar5 != 0) {
        uVar9 = (uint)puVar13[7];
        if (puVar13 == *(ulong **)((long)msp + (ulong)uVar9 * 8 + 600)) {
          *(ulong **)((long)msp + (ulong)uVar9 * 8 + 600) = puVar11;
          if (puVar11 == (ulong *)0x0) {
            bVar6 = (byte)uVar9 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          }
          else {
LAB_00104772:
            puVar8 = *(ulong **)((long)msp + 0x18);
            if (puVar11 < puVar8) goto LAB_001047f4;
            puVar11[6] = uVar5;
            puVar16 = (ulong *)puVar13[4];
            if (puVar16 != (ulong *)0x0) {
              if (puVar16 < puVar8) goto LAB_001047f4;
              puVar11[4] = (ulong)puVar16;
              puVar16[6] = (ulong)puVar11;
            }
            uVar5 = puVar13[5];
            if (uVar5 != 0) {
              if (uVar5 < *(ulong *)((long)msp + 0x18)) goto LAB_001047f4;
              puVar11[5] = uVar5;
              *(ulong **)(uVar5 + 0x30) = puVar11;
            }
          }
        }
        else {
          if (uVar5 < *(ulong *)((long)msp + 0x18)) goto LAB_001047f4;
          *(ulong **)(uVar5 + 0x20 + (ulong)(*(ulong **)(uVar5 + 0x20) != puVar13) * 8) = puVar11;
          if (puVar11 != (ulong *)0x0) goto LAB_00104772;
        }
      }
    }
    uVar4 = uVar4 + (uVar10 & 0xfffffffffffffff8);
    puVar14[1] = uVar4 | 1;
    *(ulong *)((long)puVar14 + uVar4) = uVar4;
    if (puVar14 == *(ulong **)((long)msp + 0x20)) {
      *(ulong *)((long)msp + 8) = uVar4;
      return;
    }
  }
  else {
    puVar13[1] = uVar10 & 0xfffffffffffffffe;
    puVar14[1] = uVar4 | 1;
    *(ulong *)((long)puVar14 + uVar4) = uVar4;
  }
  if (uVar4 < 0x100) {
    uVar4 = uVar4 >> 3;
    uVar10 = (long)msp + uVar4 * 0x10 + 0x48;
    if ((*msp >> ((uint)uVar4 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << ((byte)uVar4 & 0x1f);
      uVar5 = uVar10;
    }
    else {
      uVar5 = *(ulong *)((long)msp + uVar4 * 0x10 + 0x58);
      if (uVar5 < *(ulong *)((long)msp + 0x18)) {
LAB_001047f4:
        abort();
      }
    }
    *(ulong **)((long)msp + uVar4 * 0x10 + 0x58) = puVar14;
    *(ulong **)(uVar5 + 0x18) = puVar14;
    puVar14[2] = uVar5;
    puVar14[3] = uVar10;
  }
  else {
    uVar9 = (uint)(uVar4 >> 8);
    if (uVar9 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0x1f;
      if (uVar9 < 0x10000) {
        uVar7 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar7 = (uint)((uVar4 >> ((ulong)(byte)(0x26 - (char)(uVar7 ^ 0x1f)) & 0x3f) & 1) != 0) +
                (uVar7 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    puVar11 = (ulong *)((long)msp + (ulong)uVar7 * 8 + 600);
    *(uint *)(puVar14 + 7) = uVar7;
    puVar14[4] = 0;
    puVar14[5] = 0;
    if ((*(uint *)((long)msp + 4) >> (uVar7 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar7 & 0x1f);
      puVar13 = puVar11;
    }
    else {
      bVar6 = 0x39 - (char)(uVar7 >> 1);
      if (uVar7 == 0x1f) {
        bVar6 = 0;
      }
      lVar12 = uVar4 << (bVar6 & 0x3f);
      puVar11 = (ulong *)*puVar11;
      do {
        puVar8 = puVar11;
        if ((puVar8[1] & 0xfffffffffffffff8) == uVar4) {
          if ((puVar8 < *(ulong **)((long)msp + 0x18)) ||
             (puVar13 = (ulong *)puVar8[2], puVar13 < *(ulong **)((long)msp + 0x18)))
          goto LAB_001047f4;
          puVar11 = puVar8 + 2;
          puVar13[3] = (ulong)puVar14;
          lVar12 = 0x30;
          lVar15 = 0x10;
          puVar16 = (ulong *)0x0;
          goto LAB_00104674;
        }
        lVar15 = lVar12 >> 0x3f;
        lVar12 = lVar12 * 2;
        puVar11 = (ulong *)puVar8[4 - lVar15];
      } while ((ulong *)puVar8[4 - lVar15] != (ulong *)0x0);
      puVar11 = puVar8 + (4 - lVar15);
      puVar13 = puVar8;
      if (puVar11 < *(ulong **)((long)msp + 0x18)) goto LAB_001047f4;
    }
    lVar15 = 0x30;
    lVar12 = 0x10;
    puVar8 = puVar14;
    puVar16 = puVar14;
LAB_00104674:
    *puVar11 = (ulong)puVar14;
    *(ulong **)((long)puVar14 + lVar15) = puVar13;
    puVar14[3] = (ulong)puVar8;
    *(ulong **)((long)puVar14 + lVar12) = puVar16;
    plVar1 = (long *)((long)msp + 0x38);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      release_unused_segments((mstate)msp);
      return;
    }
  }
  return;
}

Assistant:

void mspace_free(mspace msp, void* mem) {
  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    (void)msp; /* placate people compiling -Wunused */
#else /* FOOTERS */
    mstate fm = (mstate)msp;
#endif /* FOOTERS */
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
}